

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  long lVar2;
  curl_slist *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  curl_strdup_callback p_Var7;
  char in_AL;
  int iVar8;
  long *plVar9;
  long *plVar10;
  void **ppvVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  void *pvVar15;
  curl_httppost *pcVar16;
  curl_httppost *pcVar17;
  uint uVar18;
  undefined8 in_RCX;
  ulong uVar19;
  curl_httppost **ppcVar20;
  undefined8 in_RDX;
  CURLFORMcode CVar21;
  size_t sVar22;
  char *pcVar23;
  undefined8 in_R8;
  long *plVar24;
  undefined8 in_R9;
  FormInfo *ptr_1;
  int *piVar25;
  long lVar26;
  FormInfo *ptr;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  ulong local_150;
  char *local_148;
  char *local_140;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar18 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar9 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar9 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar14 = (char *)0x0;
  piVar25 = (int *)0x0;
  CVar21 = CURL_FORMADD_OK;
  plVar24 = plVar9;
  bVar5 = false;
switchD_00528868_caseD_9:
  plVar10 = plVar9;
  if (CVar21 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar5)) goto code_r0x00528804;
    uVar19 = (ulong)uVar18;
    if (uVar19 < 0x29) {
      uVar18 = uVar18 + 8;
      ppvVar11 = (void **)((long)local_e8 + uVar19);
    }
    else {
      ppvVar11 = local_160;
      local_160 = local_160 + 1;
    }
    iVar8 = *(int *)ppvVar11;
    if (iVar8 != 0x11) goto LAB_00528855;
    local_148 = (char *)0x0;
    plVar24 = plVar9;
    pcVar17 = (curl_httppost *)0x0;
    goto LAB_00529013;
  }
  do {
    if ((char)plVar10[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar10);
      *plVar10 = 0;
      *(undefined1 *)(plVar10 + 1) = 0;
    }
    if ((char)plVar10[4] == '\x01') {
      (*Curl_cfree)((void *)plVar10[3]);
      plVar10[3] = 0;
      *(undefined1 *)(plVar10 + 4) = 0;
    }
    if ((char)plVar10[7] == '\x01') {
      (*Curl_cfree)((void *)plVar10[6]);
      plVar10[6] = 0;
      *(undefined1 *)(plVar10 + 7) = 0;
    }
    if ((char)plVar10[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar10[0xb]);
      plVar10[0xb] = 0;
      *(undefined1 *)(plVar10 + 0xc) = 0;
    }
    plVar24 = plVar10 + 0xf;
    plVar10 = (long *)*plVar24;
  } while ((long *)*plVar24 != (long *)0x0);
  goto LAB_00528fd7;
code_r0x00528804:
  iVar8 = *piVar25;
  pcVar14 = *(char **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar21 = CURL_FORMADD_OK;
  bVar5 = false;
  if (iVar8 == 0x11) goto switchD_00528868_caseD_9;
  bVar5 = true;
LAB_00528855:
  CVar21 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar23 = pcVar14;
  switch(iVar8) {
  case 2:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 4;
  case 1:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar24 == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar11;
      }
      CVar21 = CURL_FORMADD_NULL;
      if (pcVar23 != (char *)0x0) {
        *plVar24 = (long)pcVar23;
        CVar21 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00528868_caseD_9;
  case 3:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[2] == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar11;
      }
      plVar24[2] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_00528868_caseD_9;
  case 5:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 8;
  case 4:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[3] != 0) goto switchD_00528868_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    break;
  case 7:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar24 + 8) & 10) != 0) goto switchD_00528868_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    pcVar23 = (*Curl_cstrdup)(pcVar23);
    plVar24[3] = (long)pcVar23;
    CVar21 = CURL_FORMADD_MEMORY;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 2;
    goto LAB_00528f35;
  case 8:
    CVar21 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar6 = !bVar5;
    bVar5 = true;
    if (bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      piVar25 = (int *)*ppvVar11;
      bVar5 = piVar25 != (int *)0x0;
      CVar21 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00528868_caseD_9;
  case 10:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    if (plVar24[3] != 0) {
      CVar21 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar24 + 8) & 1) == 0) ||
         (CVar21 = CURL_FORMADD_NULL, pcVar23 == (char *)0x0)) goto switchD_00528868_caseD_9;
      local_148 = (*Curl_cstrdup)(pcVar23);
      CVar21 = CURL_FORMADD_MEMORY;
      if (local_148 == (char *)0x0) goto switchD_00528868_caseD_9;
      plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
      if (plVar10 == (long *)0x0) goto LAB_00528f41;
      plVar10[3] = (long)local_148;
      plVar10[8] = 1;
      plVar10[0xf] = plVar24[0xf];
      plVar24[0xf] = (long)plVar10;
      *(undefined1 *)(plVar10 + 4) = 1;
      goto LAB_00528d47;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    pcVar23 = (*Curl_cstrdup)(pcVar23);
    plVar24[3] = (long)pcVar23;
    CVar21 = CURL_FORMADD_MEMORY;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 1;
LAB_00528f35:
    *(undefined1 *)(plVar24 + 4) = 1;
    CVar21 = CURL_FORMADD_OK;
    goto switchD_00528868_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xb] == 0) {
      pcVar23 = (*Curl_cstrdup)(pcVar23);
      plVar24[0xb] = (long)pcVar23;
      CVar21 = CURL_FORMADD_MEMORY;
      if (pcVar23 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 0xc) = 1;
        CVar21 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00528868_caseD_9;
  case 0xc:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x30;
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[9] != 0) goto switchD_00528868_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    plVar24[9] = (long)pcVar23;
    break;
  case 0xd:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[10] == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar11;
      }
      plVar24[10] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_00528868_caseD_9;
  case 0xe:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    if (plVar24[6] == 0) {
      CVar21 = CURL_FORMADD_NULL;
      if (pcVar23 != (char *)0x0) {
        pcVar23 = (*Curl_cstrdup)(pcVar23);
        plVar24[6] = (long)pcVar23;
        CVar21 = CURL_FORMADD_MEMORY;
        if (pcVar23 != (char *)0x0) {
          *(undefined1 *)(plVar24 + 7) = 1;
          CVar21 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00528868_caseD_9;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar24 + 8) & 1) == 0) || (CVar21 = CURL_FORMADD_NULL, pcVar23 == (char *)0x0))
    goto switchD_00528868_caseD_9;
    local_148 = (*Curl_cstrdup)(pcVar23);
    CVar21 = CURL_FORMADD_MEMORY;
    if (local_148 == (char *)0x0) goto switchD_00528868_caseD_9;
    plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
    if (plVar10 == (long *)0x0) {
LAB_00528f41:
      CVar21 = CURL_FORMADD_MEMORY;
      (*Curl_cfree)(local_148);
      goto switchD_00528868_caseD_9;
    }
    plVar10[6] = (long)local_148;
    plVar10[8] = 1;
    plVar10[0xf] = plVar24[0xf];
    plVar24[0xf] = (long)plVar10;
    *(undefined1 *)(plVar10 + 7) = 1;
LAB_00528d47:
    CVar21 = CURL_FORMADD_OK;
    plVar24 = plVar10;
    goto switchD_00528868_caseD_9;
  case 0xf:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xe] == 0) {
      plVar24[0xe] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_00528868_caseD_9;
  case 0x13:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x40;
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xd] != 0) goto switchD_00528868_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_00528868_caseD_9;
    plVar24[0xd] = (long)pcVar23;
    break;
  case 0x14:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x80;
  case 6:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar11;
    }
    plVar24[5] = (long)pcVar23;
    CVar21 = CURL_FORMADD_OK;
    goto switchD_00528868_caseD_9;
  }
  plVar24[3] = (long)pcVar23;
  CVar21 = CURL_FORMADD_OK;
  goto switchD_00528868_caseD_9;
LAB_00529013:
  p_Var7 = Curl_cstrdup;
  if (*plVar24 == 0) {
    if (pcVar17 == (curl_httppost *)0x0) goto LAB_00529384;
LAB_00529032:
    local_150 = plVar24[8];
    CVar21 = CURL_FORMADD_INCOMPLETE;
    if (((((plVar24[5] != 0 & (byte)local_150) != 0) ||
         (uVar18 = (uint)local_150, (uVar18 & 9) == 9)) || ((~uVar18 & 10) == 0)) ||
       ((~uVar18 & 0x30) == 0 && plVar24[9] == 0)) goto LAB_00529389;
    if (((local_150 & 0x11) != 0) && (plVar24[6] == 0)) {
      pcVar14 = *(char **)((long)plVar24 + (ulong)(uVar18 & 0x10) * 4 + 0x18);
      pcVar23 = local_148;
      if (local_148 == (char *)0x0) {
        pcVar23 = "application/octet-stream";
      }
      if (pcVar14 != (char *)0x0) {
        lVar26 = 8;
        do {
          sVar12 = strlen(pcVar14);
          pcVar1 = *(char **)((long)&Curl_handler_file.protocol + lVar26);
          sVar13 = strlen(pcVar1);
          if ((sVar13 <= sVar12) &&
             (iVar8 = Curl_strcasecompare(pcVar14 + (sVar12 - sVar13),pcVar1), iVar8 != 0)) {
            pcVar23 = *(char **)((long)&ContentTypeForFilename_ctts + lVar26);
            break;
          }
          lVar26 = lVar26 + 0x10;
        } while (lVar26 != 0x68);
      }
      pcVar14 = (*p_Var7)(pcVar23);
      plVar24[6] = (long)pcVar14;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 7) = 1;
        local_150 = plVar24[8];
        goto LAB_00529156;
      }
LAB_0052937d:
      CVar21 = CURL_FORMADD_MEMORY;
      goto LAB_00529389;
    }
LAB_00529156:
    if (plVar24 == plVar9 && (local_150 & 4) == 0) {
      pcVar14 = (char *)*plVar24;
      CVar21 = CURL_FORMADD_MEMORY;
      if (pcVar14 == (char *)0x0) goto LAB_00529389;
      sVar22 = plVar24[2];
      if (sVar22 == 0) {
        sVar12 = strlen(pcVar14);
        sVar22 = sVar12 + 1;
      }
      pvVar15 = Curl_memdup(pcVar14,sVar22);
      *plVar24 = (long)pvVar15;
      if (pvVar15 == (void *)0x0) goto LAB_00529389;
      *(undefined1 *)(plVar24 + 1) = 1;
      local_150 = plVar24[8];
    }
    local_140 = (char *)plVar24[3];
    if ((local_150 & 0x6b) == 0) {
      if (local_140 == (char *)0x0) {
        local_140 = (char *)0x0;
      }
      else {
        sVar22 = plVar24[5];
        if (sVar22 == 0) {
          sVar12 = strlen(local_140);
          sVar22 = sVar12 + 1;
        }
        local_140 = (char *)Curl_memdup(local_140,sVar22);
        plVar24[3] = (long)local_140;
        if (local_140 == (char *)0x0) goto LAB_0052937d;
        *(undefined1 *)(plVar24 + 4) = 1;
        local_150 = plVar24[8];
      }
    }
    pcVar14 = (char *)*plVar24;
    sVar12 = plVar24[2];
    lVar26 = plVar24[5];
    pcVar23 = (char *)plVar24[9];
    lVar2 = plVar24[10];
    pcVar1 = (char *)plVar24[6];
    pcVar3 = (curl_slist *)plVar24[0xe];
    pcVar4 = (char *)plVar24[0xb];
    pvVar15 = (void *)plVar24[0xd];
    pcVar16 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
    if (pcVar16 == (curl_httppost *)0x0) goto LAB_0052937d;
    pcVar16->name = pcVar14;
    if (pcVar14 == (char *)0x0) {
      sVar12 = 0;
    }
    else if (sVar12 == 0) {
      sVar12 = strlen(pcVar14);
    }
    pcVar16->namelength = sVar12;
    pcVar16->contents = local_140;
    pcVar16->contentlen = lVar26;
    pcVar16->buffer = pcVar23;
    pcVar16->bufferlength = lVar2;
    pcVar16->contenttype = pcVar1;
    pcVar16->contentheader = pcVar3;
    pcVar16->showfilename = pcVar4;
    pcVar16->userp = pvVar15;
    pcVar16->flags = local_150 | 0x80;
    if (pcVar17 == (curl_httppost *)0x0) {
      pcVar17 = *last_post;
      if (*last_post == (curl_httppost *)0x0) {
        pcVar17 = (curl_httppost *)httppost;
      }
      pcVar17->next = pcVar16;
      ppcVar20 = last_post;
    }
    else {
      pcVar16->more = pcVar17->more;
      ppcVar20 = &pcVar17->more;
    }
    *ppcVar20 = pcVar16;
    if ((char *)plVar24[6] != (char *)0x0) {
      local_148 = (char *)plVar24[6];
    }
    plVar24 = (long *)plVar24[0xf];
    CVar21 = CURL_FORMADD_OK;
    pcVar17 = pcVar16;
    if (plVar24 == (long *)0x0) goto LAB_00528fd7;
    goto LAB_00529013;
  }
  if (plVar24[3] != 0 || pcVar17 != (curl_httppost *)0x0) goto LAB_00529032;
LAB_00529384:
  CVar21 = CURL_FORMADD_INCOMPLETE;
LAB_00529389:
  do {
    if ((char)plVar24[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar24);
      *plVar24 = 0;
      *(undefined1 *)(plVar24 + 1) = 0;
    }
    if ((char)plVar24[4] == '\x01') {
      (*Curl_cfree)((void *)plVar24[3]);
      plVar24[3] = 0;
      *(undefined1 *)(plVar24 + 4) = 0;
    }
    if ((char)plVar24[7] == '\x01') {
      (*Curl_cfree)((void *)plVar24[6]);
      plVar24[6] = 0;
      *(undefined1 *)(plVar24 + 7) = 0;
    }
    if ((char)plVar24[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar24[0xb]);
      plVar24[0xb] = 0;
      *(undefined1 *)(plVar24 + 0xc) = 0;
    }
    plVar24 = (long *)plVar24[0xf];
  } while (plVar24 != (long *)0x0);
LAB_00528fd7:
  do {
    plVar24 = (long *)plVar9[0xf];
    (*Curl_cfree)(plVar9);
    plVar9 = plVar24;
  } while (plVar24 != (long *)0x0);
  return CVar21;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}